

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_source.hpp
# Opt level: O2

void __thiscall
ItemSourceReward::ItemSourceReward
          (ItemSourceReward *this,uint32_t address_in_rom,string *name,uint8_t reward_id,
          string *node_id,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *hints)

{
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ItemSource::ItemSource(&this->super_ItemSource,name,node_id,hints);
  (this->super_ItemSource)._vptr_ItemSource = (_func_int **)&PTR__ItemSource_00246730;
  this->_address_in_rom = address_in_rom;
  this->_reward_id = reward_id;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"owned by someone willing to give it to the brave",&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_ItemSource)._hints,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

ItemSourceReward(uint32_t address_in_rom, const std::string& name, uint8_t reward_id, const std::string& node_id = "", const std::vector<std::string>& hints = {}) :
        ItemSource      (name, node_id, hints),
        _reward_id      (reward_id),
        _address_in_rom (address_in_rom)
    {
        this->add_hint("owned by someone willing to give it to the brave");
    }